

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

InsertResult * __thiscall
stick::HashMap<stick::String,_unsigned_long,_stick::DefaultHash>::insert
          (InsertResult *__return_storage_ptr__,
          HashMap<stick::String,_unsigned_long,_stick::DefaultHash> *this,KeyValuePair *_val)

{
  Node *pNVar1;
  char *__s1;
  Size SVar2;
  Allocator *pAVar3;
  ValueType VVar4;
  int iVar5;
  Size SVar6;
  undefined4 extraout_var;
  undefined8 *puVar7;
  ulong uVar8;
  Bucket *pBVar9;
  Node *pNVar10;
  Node **ppNVar11;
  ulong uVar12;
  Size extraout_RDX;
  Node *pNVar13;
  Node *pNVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  char *local_68;
  Size local_60;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  SVar6 = DefaultHash<stick::String>::operator()
                    ((DefaultHash<stick::String> *)&this->field_0x24,&_val->key);
  uVar12 = SVar6 % this->m_bucketCount;
  pBVar9 = this->m_buckets;
  pNVar1 = pBVar9[uVar12].first;
  pNVar13 = (Node *)0x0;
  pNVar14 = (Node *)0x0;
  if (pNVar1 != (Node *)0x0) {
    __s1 = (_val->key).m_cStr;
    SVar6 = (_val->key).m_length;
    pNVar14 = (Node *)0x0;
    do {
      pNVar13 = pNVar1;
      SVar2 = (pNVar13->kv).key.m_length;
      bVar16 = SVar6 == 0 && SVar2 == 0;
      if ((SVar6 != 0) && (SVar2 != 0)) {
        iVar5 = strcmp(__s1,(pNVar13->kv).key.m_cStr);
        bVar16 = iVar5 == 0;
      }
      if (bVar16) {
        if (pNVar13->prev != pNVar14) {
          __assert_fail("n->prev == _prev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/HashMap.hpp"
                        ,0x27d,
                        "void stick::HashMap<stick::String, unsigned long>::findHelper(Size, const KeyType &, Node *&, Node *&) const [K = stick::String, V = unsigned long, H = stick::DefaultHash]"
                       );
        }
        goto LAB_0011012a;
      }
      pNVar1 = pNVar13->next;
      pNVar14 = pNVar13;
    } while (pNVar13->next != (Node *)0x0);
    pNVar13 = (Node *)0x0;
  }
LAB_0011012a:
  if (pNVar13 == (Node *)0x0) {
    SVar6 = (_val->key).m_length;
    pAVar3 = (_val->key).m_allocator;
    if ((_val->key).m_cStr == (char *)0x0) {
      local_68 = (char *)0x0;
      local_60 = 0;
    }
    else {
      iVar5 = (*pAVar3->_vptr_Allocator[2])(pAVar3,SVar6 + 1,1);
      local_68 = (char *)CONCAT44(extraout_var,iVar5);
      memset(local_68,0,SVar6 + 1);
      if (local_68 == (char *)0x0) {
        __assert_fail("m_cStr != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                      ,0x1a0,"void stick::String::reserve(Size)");
      }
      strcpy(local_68,(_val->key).m_cStr);
      local_60 = SVar6;
    }
    VVar4 = _val->value;
    iVar5 = (*this->m_alloc->_vptr_Allocator[2])(this->m_alloc,0x50,8);
    puVar7 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
    *puVar7 = 0x50;
    pNVar13 = (Node *)(puVar7 + 1);
    Node::Node(pNVar13);
    puVar7[8] = uVar12;
    SVar2 = this->m_nextNodeID;
    this->m_nextNodeID = SVar2 + 1;
    puVar7[9] = SVar2;
    if (puVar7[1] != 0) {
      (**(code **)(*(long *)puVar7[4] + 0x18))();
      (pNVar13->kv).key.m_cStr = (char *)0x0;
      puVar7[2] = 0;
      puVar7[3] = 0;
    }
    (pNVar13->kv).key.m_cStr = local_68;
    puVar7[4] = pAVar3;
    puVar7[2] = SVar6;
    puVar7[3] = local_60;
    puVar7[5] = VVar4;
    if (pNVar14 == (Node *)0x0) {
      ppNVar11 = &pBVar9[uVar12].first;
    }
    else {
      puVar7[6] = pNVar14;
      ppNVar11 = &pNVar14->next;
    }
    *ppNVar11 = pNVar13;
    uVar15 = this->m_bucketCount;
    uVar8 = this->m_count + 1;
    this->m_count = uVar8;
    fVar17 = (float)uVar8 / (float)uVar15;
    bVar16 = true;
    if ((float)this->m_maxLoadFactor <= fVar17 && fVar17 != (float)this->m_maxLoadFactor) {
      uVar8 = uVar15 * 2;
      iVar5 = (*this->m_alloc->_vptr_Allocator[2])(this->m_alloc,uVar15 << 4,8);
      pBVar9 = (Bucket *)CONCAT44(extraout_var_01,iVar5);
      if (uVar8 != 0) {
        memset(pBVar9,0,uVar15 << 4);
      }
      if (this->m_bucketCount != 0) {
        uVar15 = 0;
        do {
          pNVar1 = this->m_buckets[uVar15].first;
          while (pNVar1 != (Node *)0x0) {
            SVar6 = DefaultHash<stick::String>::operator()
                              ((DefaultHash<stick::String> *)&this->field_0x24,(String *)pNVar1);
            pNVar14 = pBVar9[SVar6 % uVar8].first;
            if (pBVar9[SVar6 % uVar8].first == (Node *)0x0) {
              ppNVar11 = &pBVar9[SVar6 % uVar8].first;
              pNVar10 = (Node *)0x0;
            }
            else {
              do {
                pNVar10 = pNVar14;
                pNVar14 = pNVar10->next;
              } while (pNVar10->next != (Node *)0x0);
              ppNVar11 = &pNVar10->next;
            }
            pNVar14 = pNVar1->next;
            *ppNVar11 = pNVar1;
            pNVar1->prev = pNVar10;
            pNVar1->next = (Node *)0x0;
            pNVar1 = pNVar14;
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < this->m_bucketCount);
      }
      (*this->m_alloc->_vptr_Allocator[3])();
      this->m_bucketAllocationSize = extraout_RDX;
      this->m_buckets = pBVar9;
      this->m_bucketCount = uVar8;
      bVar16 = true;
    }
  }
  else {
    if (pNVar14 != pNVar13->prev) {
      __assert_fail("prev == n->prev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/HashMap.hpp"
                    ,0x161,
                    "InsertResult stick::HashMap<stick::String, unsigned long>::insert(KeyValuePair &&) [K = stick::String, V = unsigned long, H = stick::DefaultHash]"
                   );
    }
    (pNVar13->kv).value = _val->value;
    bVar16 = false;
  }
  (__return_storage_ptr__->iterator).map = this;
  (__return_storage_ptr__->iterator).bucketIndex = uVar12;
  (__return_storage_ptr__->iterator).node = pNVar13;
  __return_storage_ptr__->inserted = bVar16;
  return __return_storage_ptr__;
}

Assistant:

inline InsertResult insert(KeyValuePair && _val)
    {
        Size bi = bucketIndex(_val.key);
        Bucket & b = m_buckets[bi];

        // check if the key allready exists
        Node *n, *prev;
        findHelper(bi, _val.key, n, prev);

        // the key allready exists, change the value
        if (n)
        {
            STICK_ASSERT(prev == n->prev);
            n->kv.value = std::move(_val.value);
            return { Iter(*this, bi, n), false };
        }
        else
        {
            // otherwise create the node n stuff
            n = createNode({ _val.key, std::move(_val.value) }, bi);
            if (prev)
            {
                n->prev = prev;
                prev->next = n;
            }
            else
            {
                b.first = n;
            }
            ++m_count;
        }

        Float32 lf = loadFactor();
        if (lf > m_maxLoadFactor)
        {
            rehash(m_bucketCount * 2);
        }

        return { Iter(*this, bi, n), true };
    }